

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRC_Command.h
# Opt level: O1

void __thiscall
GenericCommandWrapperIRCCommand::~GenericCommandWrapperIRCCommand
          (GenericCommandWrapperIRCCommand *this)

{
  IRCCommand::~IRCCommand(&this->super_IRCCommand);
  operator_delete(this,0x60);
  return;
}

Assistant:

class JUPITER_BOT_API GenericCommandWrapperIRCCommand : public IRCCommand
{
public:
	/**
	* @brief Triggers the underlying GenericCommand and outputs the result
	*
	* @param in_server IRC server to deliver result to
	* @param in_channel Name of the channel to deliver result to (if result is not 'Private' type)
	* @param in_nick Name of the user to deliver result to (if result is 'Private' type)
	* @param in_parameters Parameters to pass to the GenericCommand's trigger()
	*/
	void trigger(IRC_Bot *in_server, std::string_view in_channel, std::string_view in_nick, std::string_view in_parameters) override;

	/**
	* @brief Forwards the help message from the underlying GenericCommand
	*
	* @param in_parameters Parameters to forward to the GenericCommand's getHelp()
	* @return Help string from the GenericCommand
	*/
	std::string_view getHelp(std::string_view in_parameters) override;

	/**
	* @brief Copies the GenericCommandWrapperIRCCommand
	*
	* @return Copy of the GenericCommandWrapperIRCCommand
	*/
	IRCCommand *copy() override;

	/**
	* @brief Fetches the underlying GenericCommand
	*
	* @return GenericCommand this wrapper interfaces with
	*/
	const Jupiter::GenericCommand &getGenericCommand() const;

	/**
	* @brief Copy constructor for the GenericCommandWrapperIRCCommand class
	*/
	GenericCommandWrapperIRCCommand(const GenericCommandWrapperIRCCommand &in_command);

	/**
	* @brief Wrapper constructor for the GenericCommandWrapperIRCCommand class
	*/
	GenericCommandWrapperIRCCommand(Jupiter::GenericCommand &in_command);

private:
	Jupiter::GenericCommand *m_command;
}